

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

FloorDivBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_floordivbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x37f) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x37f;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    FloorDivBroadcastableLayerParams::FloorDivBroadcastableLayerParams
              (this_00.floordivbroadcastable_);
    (this->layer_).floordivbroadcastable_ = (FloorDivBroadcastableLayerParams *)this_00;
  }
  return (FloorDivBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::FloorDivBroadcastableLayerParams* NeuralNetworkLayer::mutable_floordivbroadcastable() {
  if (!has_floordivbroadcastable()) {
    clear_layer();
    set_has_floordivbroadcastable();
    layer_.floordivbroadcastable_ = new ::CoreML::Specification::FloorDivBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.floorDivBroadcastable)
  return layer_.floordivbroadcastable_;
}